

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O0

void __thiscall
bloom_tests::merkle_block_4_test_p2pubkey_only::test_method(merkle_block_4_test_p2pubkey_only *this)

{
  string_view hex;
  string_view hex_00;
  Span<const_std::byte> sp;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  bool bVar1;
  long in_FS_OFFSET;
  DataStream stream;
  CBloomFilter filter;
  CMerkleBlock merkleBlock;
  CBlock block;
  CMerkleBlock *in_stack_fffffffffffff0f8;
  undefined7 in_stack_fffffffffffff100;
  undefined1 in_stack_fffffffffffff107;
  CMerkleBlock *in_stack_fffffffffffff108;
  undefined7 in_stack_fffffffffffff110;
  undefined1 in_stack_fffffffffffff117;
  CBlock *in_stack_fffffffffffff118;
  undefined7 in_stack_fffffffffffff120;
  undefined1 in_stack_fffffffffffff127;
  transaction_identifier<false> *in_stack_fffffffffffff128;
  COutPoint *in_stack_fffffffffffff130;
  COutPoint *outpoint;
  undefined7 in_stack_fffffffffffff138;
  undefined1 in_stack_fffffffffffff13f;
  undefined8 in_stack_fffffffffffff140;
  undefined7 in_stack_fffffffffffff148;
  undefined1 in_stack_fffffffffffff14f;
  undefined8 in_stack_fffffffffffff150;
  uint nElements;
  CBloomFilter *in_stack_fffffffffffff158;
  const_string local_e58 [2];
  lazy_ostream local_e38 [4];
  const_string local_dd0 [2];
  lazy_ostream local_db0 [4];
  const_string local_d48 [2];
  lazy_ostream local_d28 [2];
  assertion_result local_d08 [3];
  ParamsWrapper<TransactionSerParams,_CBlock> local_cb0;
  long local_8;
  
  nElements = (uint)((ulong)in_stack_fffffffffffff150 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(in_stack_fffffffffffff118);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<5093UL>___1,_0,_0,_0,_130,_187,_134,_156,_243,_167,_______>
            ();
  Span<std::byte_const>::Span<std::array<std::byte,2546ul>>
            ((Span<const_std::byte> *)in_stack_fffffffffffff108,
             (array<std::byte,_2546UL> *)
             CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),in_stack_fffffffffffff0f8
            );
  sp.m_data._7_1_ = in_stack_fffffffffffff127;
  sp.m_data._0_7_ = in_stack_fffffffffffff120;
  sp.m_size = (size_t)in_stack_fffffffffffff128;
  DataStream::DataStream
            ((DataStream *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),sp);
  local_cb0 = TransactionSerParams::operator()
                        ((TransactionSerParams *)in_stack_fffffffffffff108,
                         (CBlock *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100));
  DataStream::operator>>
            ((DataStream *)in_stack_fffffffffffff108,
             (ParamsWrapper<TransactionSerParams,_CBlock> *)
             CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100));
  CBloomFilter::CBloomFilter
            (in_stack_fffffffffffff158,nElements,
             (double)CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148),
             (uint)((ulong)in_stack_fffffffffffff140 >> 0x20),
             (uchar)((ulong)in_stack_fffffffffffff140 >> 0x18));
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<131UL>___4,_234,_175,_194,_49,_77,_239,_76,_169,_138,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,65ul>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff108,
             (array<unsigned_char,_65UL> *)
             CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),in_stack_fffffffffffff0f8
            );
  vKey.m_data._7_1_ = in_stack_fffffffffffff127;
  vKey.m_data._0_7_ = in_stack_fffffffffffff120;
  vKey.m_size = (size_t)in_stack_fffffffffffff128;
  CBloomFilter::insert((CBloomFilter *)in_stack_fffffffffffff108,vKey);
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<41UL>___182,_239,_216,_13,_153,_23,_159,_79,_79,_246,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff108,
             (array<unsigned_char,_20UL> *)
             CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),in_stack_fffffffffffff0f8
            );
  vKey_00.m_data._7_1_ = in_stack_fffffffffffff127;
  vKey_00.m_data._0_7_ = in_stack_fffffffffffff120;
  vKey_00.m_size = (size_t)in_stack_fffffffffffff128;
  CBloomFilter::insert((CBloomFilter *)in_stack_fffffffffffff108,vKey_00);
  CMerkleBlock::CMerkleBlock
            (in_stack_fffffffffffff108,
             (CBlock *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
             (CBloomFilter *)in_stack_fffffffffffff0f8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff108,
               (pointer)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (unsigned_long)in_stack_fffffffffffff0f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (const_string *)in_stack_fffffffffffff130,(size_t)in_stack_fffffffffffff128,
               (const_string *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120));
    CBlockHeader::GetHash(&in_stack_fffffffffffff118->super_CBlockHeader);
    CBlockHeader::GetHash(&in_stack_fffffffffffff118->super_CBlockHeader);
    ::operator==((base_blob<256U> *)in_stack_fffffffffffff108,
                 (base_blob<256U> *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff108,(bool)in_stack_fffffffffffff107);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff108,
               (pointer)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (unsigned_long)in_stack_fffffffffffff0f8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff108,
               (pointer)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (unsigned_long)in_stack_fffffffffffff0f8);
    in_stack_fffffffffffff0f8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d08,local_d28,local_d48,0x1aa,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff108,
               (pointer)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (unsigned_long)in_stack_fffffffffffff0f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (const_string *)in_stack_fffffffffffff130,(size_t)in_stack_fffffffffffff128,
               (const_string *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff118,
               (char *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110));
    hex._M_str._0_7_ = in_stack_fffffffffffff120;
    hex._M_len = (size_t)in_stack_fffffffffffff118;
    hex._M_str._7_1_ = in_stack_fffffffffffff127;
    transaction_identifier<false>::FromHex(hex);
    std::optional<transaction_identifier<false>_>::value
              ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff108);
    COutPoint::COutPoint
              ((COutPoint *)in_stack_fffffffffffff108,
               (Txid *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (uint32_t)((ulong)in_stack_fffffffffffff0f8 >> 0x20));
    CBloomFilter::contains
              ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               in_stack_fffffffffffff130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff108,(bool)in_stack_fffffffffffff107);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff108,
               (pointer)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (unsigned_long)in_stack_fffffffffffff0f8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff108,
               (pointer)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (unsigned_long)in_stack_fffffffffffff0f8);
    in_stack_fffffffffffff0f8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_db0 + 3),local_db0,local_dd0,0x1ad,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0f8);
    in_stack_fffffffffffff13f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff13f);
  do {
    outpoint = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff108,
               (pointer)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (unsigned_long)in_stack_fffffffffffff0f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (const_string *)outpoint,(size_t)in_stack_fffffffffffff128,
               (const_string *)CONCAT17(in_stack_fffffffffffff127,in_stack_fffffffffffff120));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff118,
               (char *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110));
    hex_00._M_str._0_7_ = in_stack_fffffffffffff120;
    hex_00._M_len = (size_t)in_stack_fffffffffffff118;
    hex_00._M_str._7_1_ = in_stack_fffffffffffff127;
    transaction_identifier<false>::FromHex(hex_00);
    in_stack_fffffffffffff128 =
         std::optional<transaction_identifier<false>_>::value
                   ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff108);
    COutPoint::COutPoint
              ((COutPoint *)in_stack_fffffffffffff108,
               (Txid *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (uint32_t)((ulong)in_stack_fffffffffffff0f8 >> 0x20));
    in_stack_fffffffffffff127 =
         CBloomFilter::contains
                   ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
                    outpoint);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff108,(bool)in_stack_fffffffffffff107);
    in_stack_fffffffffffff118 = (CBlock *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff108,
               (pointer)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (unsigned_long)in_stack_fffffffffffff0f8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff108,
               (pointer)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (unsigned_long)in_stack_fffffffffffff0f8);
    in_stack_fffffffffffff0f8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_e38 + 3),local_e38,local_e58,0x1af,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0f8);
    in_stack_fffffffffffff117 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff117);
  CMerkleBlock::~CMerkleBlock(in_stack_fffffffffffff0f8);
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_fffffffffffff0f8);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff0f8);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffff0f8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_4_test_p2pubkey_only)
{
    // Random real block (000000000000b731f2eef9e8c63173adfb07e41bd53eb0ef0a6b720d6cb6dea4)
    // With 7 txes
    CBlock block;
    DataStream stream{
        "0100000082bb869cf3a793432a66e826e05a6fc37469f8efb7421dc880670100000000007f16c5962e8bd963659c793ce370d95f093bc7e367117b3c30c1f8fdd0d9728776381b4d4c86041b554b85290701000000010000000000000000000000000000000000000000000000000000000000000000ffffffff07044c86041b0136ffffffff0100f2052a01000000434104eaafc2314def4ca98ac970241bcab022b9c1e1f4ea423a20f134c876f2c01ec0f0dd5b2e86e7168cefe0d81113c3807420ce13ad1357231a2252247d97a46a91ac000000000100000001bcad20a6a29827d1424f08989255120bf7f3e9e3cdaaa6bb31b0737fe048724300000000494830450220356e834b046cadc0f8ebb5a8a017b02de59c86305403dad52cd77b55af062ea10221009253cd6c119d4729b77c978e1e2aa19f5ea6e0e52b3f16e32fa608cd5bab753901ffffffff02008d380c010000001976a9142b4b8072ecbba129b6453c63e129e643207249ca88ac0065cd1d000000001976a9141b8dd13b994bcfc787b32aeadf58ccb3615cbd5488ac000000000100000003fdacf9b3eb077412e7a968d2e4f11b9a9dee312d666187ed77ee7d26af16cb0b000000008c493046022100ea1608e70911ca0de5af51ba57ad23b9a51db8d28f82c53563c56a05c20f5a87022100a8bdc8b4a8acc8634c6b420410150775eb7f2474f5615f7fccd65af30f310fbf01410465fdf49e29b06b9a1582287b6279014f834edc317695d125ef623c1cc3aaece245bd69fcad7508666e9c74a49dc9056d5fc14338ef38118dc4afae5fe2c585caffffffff309e1913634ecb50f3c4f83e96e70b2df071b497b8973a3e75429df397b5af83000000004948304502202bdb79c596a9ffc24e96f4386199aba386e9bc7b6071516e2b51dda942b3a1ed022100c53a857e76b724fc14d45311eac5019650d415c3abb5428f3aae16d8e69bec2301ffffffff2089e33491695080c9edc18a428f7d834db5b6d372df13ce2b1b0e0cbcb1e6c10000000049483045022100d4ce67c5896ee251c810ac1ff9ceccd328b497c8f553ab6e08431e7d40bad6b5022033119c0c2b7d792d31f1187779c7bd95aefd93d90a715586d73801d9b47471c601ffffffff0100714460030000001976a914c7b55141d097ea5df7a0ed330cf794376e53ec8d88ac0000000001000000045bf0e214aa4069a3e792ecee1e1bf0c1d397cde8dd08138f4b72a00681743447000000008b48304502200c45de8c4f3e2c1821f2fc878cba97b1e6f8807d94930713aa1c86a67b9bf1e40221008581abfef2e30f957815fc89978423746b2086375ca8ecf359c85c2a5b7c88ad01410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95ffffffffd669f7d7958d40fc59d2253d88e0f248e29b599c80bbcec344a83dda5f9aa72c000000008a473044022078124c8beeaa825f9e0b30bff96e564dd859432f2d0cb3b72d3d5d93d38d7e930220691d233b6c0f995be5acb03d70a7f7a65b6bc9bdd426260f38a1346669507a3601410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95fffffffff878af0d93f5229a68166cf051fd372bb7a537232946e0a46f53636b4dafdaa4000000008c493046022100c717d1714551663f69c3c5759bdbb3a0fcd3fab023abc0e522fe6440de35d8290221008d9cbe25bffc44af2b18e81c58eb37293fd7fe1c2e7b46fc37ee8c96c50ab1e201410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95ffffffff27f2b668859cd7f2f894aa0fd2d9e60963bcd07c88973f425f999b8cbfd7a1e2000000008c493046022100e00847147cbf517bcc2f502f3ddc6d284358d102ed20d47a8aa788a62f0db780022100d17b2d6fa84dcaf1c95d88d7e7c30385aecf415588d749afd3ec81f6022cecd701410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95ffffffff0100c817a8040000001976a914b6efd80d99179f4f4ff6f4dd0a007d018c385d2188ac000000000100000001834537b2f1ce8ef9373a258e10545ce5a50b758df616cd4356e0032554ebd3c4000000008b483045022100e68f422dd7c34fdce11eeb4509ddae38201773dd62f284e8aa9d96f85099d0b002202243bd399ff96b649a0fad05fa759d6a882f0af8c90cf7632c2840c29070aec20141045e58067e815c2f464c6a2a15f987758374203895710c2d452442e28496ff38ba8f5fd901dc20e29e88477167fe4fc299bf818fd0d9e1632d467b2a3d9503b1aaffffffff0280d7e636030000001976a914f34c3e10eb387efe872acb614c89e78bfca7815d88ac404b4c00000000001976a914a84e272933aaf87e1715d7786c51dfaeb5b65a6f88ac00000000010000000143ac81c8e6f6ef307dfe17f3d906d999e23e0189fda838c5510d850927e03ae7000000008c4930460221009c87c344760a64cb8ae6685a3eec2c1ac1bed5b88c87de51acd0e124f266c16602210082d07c037359c3a257b5c63ebd90f5a5edf97b2ac1c434b08ca998839f346dd40141040ba7e521fa7946d12edbb1d1e95a15c34bd4398195e86433c92b431cd315f455fe30032ede69cad9d1e1ed6c3c4ec0dbfced53438c625462afb792dcb098544bffffffff0240420f00000000001976a9144676d1b820d63ec272f1900d59d43bc6463d96f888ac40420f00000000001976a914648d04341d00d7968b3405c034adc38d4d8fb9bd88ac00000000010000000248cc917501ea5c55f4a8d2009c0567c40cfe037c2e71af017d0a452ff705e3f1000000008b483045022100bf5fdc86dc5f08a5d5c8e43a8c9d5b1ed8c65562e280007b52b133021acd9acc02205e325d613e555f772802bf413d36ba807892ed1a690a77811d3033b3de226e0a01410429fa713b124484cb2bd7b5557b2c0b9df7b2b1fee61825eadc5ae6c37a9920d38bfccdc7dc3cb0c47d7b173dbc9db8d37db0a33ae487982c59c6f8606e9d1791ffffffff41ed70551dd7e841883ab8f0b16bf04176b7d1480e4f0af9f3d4c3595768d068000000008b4830450221008513ad65187b903aed1102d1d0c47688127658c51106753fed0151ce9c16b80902201432b9ebcb87bd04ceb2de66035fbbaf4bf8b00d1cfe41f1a1f7338f9ad79d210141049d4cf80125bf50be1709f718c07ad15d0fc612b7da1f5570dddc35f2a352f0f27c978b06820edca9ef982c35fda2d255afba340068c5035552368bc7200c1488ffffffff0100093d00000000001976a9148edb68822f1ad580b043c7b3df2e400f8699eb4888ac00000000"_hex,
    };
    stream >> TX_WITH_WITNESS(block);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_P2PUBKEY_ONLY);
    // Match the generation pubkey
    filter.insert("04eaafc2314def4ca98ac970241bcab022b9c1e1f4ea423a20f134c876f2c01ec0f0dd5b2e86e7168cefe0d81113c3807420ce13ad1357231a2252247d97a46a91"_hex_u8);
    // ...and the output address of the 4th transaction
    filter.insert("b6efd80d99179f4f4ff6f4dd0a007d018c385d21"_hex_u8);

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    // We should match the generation outpoint
    BOOST_CHECK(filter.contains(COutPoint(Txid::FromHex("147caa76786596590baa4e98f5d9f48b86c7765e489f7a6ff3360fe5c674360b").value(), 0)));
    // ... but not the 4th transaction's output (its not pay-2-pubkey)
    BOOST_CHECK(!filter.contains(COutPoint(Txid::FromHex("02981fa052f0481dbc5868f4fc2166035a10f27a03cfd2de67326471df5bc041").value(), 0)));
}